

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O0

void secp256k1_gej_cmov(secp256k1_gej *r,secp256k1_gej *a,int flag)

{
  uint in_EDX;
  secp256k1_gej *in_RSI;
  long in_RDI;
  undefined4 in_stack_ffffffffffffffe8;
  
  secp256k1_gej_verify(in_RSI);
  secp256k1_gej_verify(in_RSI);
  secp256k1_fe_cmov(&in_RSI->x,(secp256k1_fe *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),0);
  secp256k1_fe_cmov(&in_RSI->x,(secp256k1_fe *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),0);
  secp256k1_fe_cmov(&in_RSI->x,(secp256k1_fe *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),0);
  *(uint *)(in_RDI + 0x90) =
       (*(uint *)(in_RDI + 0x90) ^ in_RSI->infinity) & in_EDX ^ *(uint *)(in_RDI + 0x90);
  secp256k1_gej_verify(in_RSI);
  return;
}

Assistant:

static SECP256K1_INLINE void secp256k1_gej_cmov(secp256k1_gej *r, const secp256k1_gej *a, int flag) {
    SECP256K1_GEJ_VERIFY(r);
    SECP256K1_GEJ_VERIFY(a);

    secp256k1_fe_cmov(&r->x, &a->x, flag);
    secp256k1_fe_cmov(&r->y, &a->y, flag);
    secp256k1_fe_cmov(&r->z, &a->z, flag);
    r->infinity ^= (r->infinity ^ a->infinity) & flag;

    SECP256K1_GEJ_VERIFY(r);
}